

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLDHPrivateKey.cpp
# Opt level: O3

void __thiscall OSSLDHPrivateKey::OSSLDHPrivateKey(OSSLDHPrivateKey *this,DH *inDH)

{
  *(undefined ***)&this->super_DHPrivateKey = &PTR_serialise_00151fc8;
  ByteString::ByteString(&(this->super_DHPrivateKey).x);
  ByteString::ByteString(&(this->super_DHPrivateKey).p);
  ByteString::ByteString(&(this->super_DHPrivateKey).g);
  *(undefined ***)&this->super_DHPrivateKey = &PTR_serialise_001507b0;
  this->dh = (DH *)0x0;
  setFromOSSL(this,inDH);
  return;
}

Assistant:

OSSLDHPrivateKey::OSSLDHPrivateKey(const DH* inDH)
{
	dh = NULL;

	setFromOSSL(inDH);
}